

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexParser.cpp
# Opt level: O2

bool __thiscall
UnifiedRegex::Parser<UTF8EncodingPolicyBase<false>,_false>::SurrogatePairPass1
          (Parser<UTF8EncodingPolicyBase<false>,_false> *this,Node **node,
          MatchCharNode *deferredCharNode,bool *previousSurrogatePart)

{
  code *pcVar1;
  long lVar2;
  bool bVar3;
  undefined4 *puVar4;
  MatchCharNode *this_00;
  SurrogatePairTracker *pSVar5;
  Node *pNVar6;
  AltNode *this_01;
  AltNode *this_02;
  long lVar7;
  uint n;
  int i_1;
  int i;
  long lVar8;
  int iVar9;
  AltNode *pAVar10;
  AltNode *local_98;
  Node *equivNode [4];
  Char local_58 [4];
  codepoint_t equivClass [4];
  uint local_3c [2];
  uint tableIndex;
  uint actualHigh;
  char16 lower;
  char16 upper;
  
  if ((((((this->scriptContext->config).threadConfig)->m_ES6Unicode != true) ||
       (this->unicodeFlagPresent != true)) ||
      (pSVar5 = this->currentSurrogatePairNode, pSVar5 == (SurrogatePairTracker *)0x0)) ||
     (pSVar5->location != this->next)) {
    return false;
  }
  if (pSVar5->rangeLocation != (EncodedChar *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                       ,0x723,"(!this->currentSurrogatePairNode->IsInsideRange())",
                       "Should not be calling this pass if we are currently inside a range.");
    if (!bVar3) goto LAB_00d2e348;
    *puVar4 = 0;
    pSVar5 = this->currentSurrogatePairNode;
  }
  local_3c[0] = 0;
  local_3c[1] = 0;
  if (this->caseInsensitiveFlagPresent == true) {
    bVar3 = CaseInsensitive::RangeToEquivClass
                      (local_3c,pSVar5->value,pSVar5->value,local_3c + 1,(codepoint_t *)local_58);
    if (!bVar3) {
      pSVar5 = this->currentSurrogatePairNode;
      goto LAB_00d2e19f;
    }
    iVar9 = 0;
    for (lVar8 = 0; lVar8 != 4; lVar8 = lVar8 + 1) {
      lVar7 = 0;
      do {
        if (lVar8 == lVar7) {
          bVar3 = Js::NumberUtilities::IsInSupplementaryPlane
                            (*(codepoint_t *)(local_58 + lVar8 * 2));
          if (bVar3) {
            Js::NumberUtilities::CodePointAsSurrogatePair
                      (*(codepoint_t *)(local_58 + lVar8 * 2),(char16 *)&tableIndex,
                       (char16 *)((long)&tableIndex + 2));
            this_00 = (MatchCharNode *)
                      CreateSurrogatePairAtom(this,(char16)tableIndex,tableIndex._2_2_);
          }
          else {
            this_00 = (MatchCharNode *)new<Memory::ArenaAllocator>(0x48,this->ctAllocator,0x35916e);
            MatchCharNode::MatchCharNode(this_00,local_58[lVar8 * 2]);
          }
          equivNode[(long)iVar9 + -1] = &this_00->super_Node;
          iVar9 = iVar9 + 1;
          break;
        }
        lVar2 = lVar7 * 2;
        lVar7 = lVar7 + 1;
      } while (*(codepoint_t *)(local_58 + lVar8 * 2) != *(codepoint_t *)(local_58 + lVar2));
    }
    if (iVar9 < 1) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar4 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                         ,0x748,"(indexForNextNode > 0)","indexForNextNode > 0");
      if (!bVar3) goto LAB_00d2e348;
      *puVar4 = 0;
LAB_00d2e23e:
      this_01 = (AltNode *)new<Memory::ArenaAllocator>(0x60,this->ctAllocator,0x35916e);
      AltNode::AltNode(this_01,&local_98->super_Node,(AltNode *)0x0);
      pAVar10 = this_01;
      for (lVar8 = 1; local_98 = this_01, lVar8 < iVar9; lVar8 = lVar8 + 1) {
        this_02 = (AltNode *)new<Memory::ArenaAllocator>(0x60,this->ctAllocator,0x35916e);
        AltNode::AltNode(this_02,equivNode[lVar8 + -1],(AltNode *)0x0);
        pAVar10->tail = this_02;
        pAVar10 = this_02;
      }
    }
    else if (iVar9 != 1) goto LAB_00d2e23e;
    *node = &local_98->super_Node;
  }
  else {
LAB_00d2e19f:
    Js::NumberUtilities::CodePointAsSurrogatePair
              (pSVar5->value,(char16 *)&tableIndex,(char16 *)((long)&tableIndex + 2));
    pNVar6 = CreateSurrogatePairAtom(this,(char16)tableIndex,tableIndex._2_2_);
    *node = pNVar6;
  }
  *previousSurrogatePart = false;
  n = this->currentSurrogatePairNode->length;
  if (this->inputLim < this->next + n) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                       ,0x761,"(ECCanConsume(this->currentSurrogatePairNode->length))",
                       "ECCanConsume(this->currentSurrogatePairNode->length)");
    if (!bVar3) {
LAB_00d2e348:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
    n = this->currentSurrogatePairNode->length;
  }
  ECConsumeMultiUnit(this,n);
  pSVar5 = this->currentSurrogatePairNode;
  (this->super_UTF8EncodingPolicyBase<false>).m_cMultiUnits = pSVar5->multiUnits;
  this->currentSurrogatePairNode = pSVar5->next;
  return true;
}

Assistant:

bool Parser<P, IsLiteral>::SurrogatePairPass1(Node*& node, MatchCharNode* deferredCharNode, bool& previousSurrogatePart)
    {
        if (!this->scriptContext->GetConfig()->IsES6UnicodeExtensionsEnabled() || !unicodeFlagPresent)
        {
            return false;
        }

        if (this->currentSurrogatePairNode != nullptr && this->currentSurrogatePairNode->location == this->next)
        {
            AssertMsg(!this->currentSurrogatePairNode->IsInsideRange(), "Should not be calling this pass if we are currently inside a range.");
            char16 lower, upper;

            uint tableIndex = 0, actualHigh = 0;
            codepoint_t equivClass[CaseInsensitive::EquivClassSize];

            if (caseInsensitiveFlagPresent && CaseInsensitive::RangeToEquivClass(tableIndex, this->currentSurrogatePairNode->value, this->currentSurrogatePairNode->value, actualHigh, equivClass))
            {
                Node *equivNode[CaseInsensitive::EquivClassSize];
                int indexForNextNode = 0;
                for (int i = 0; i < CaseInsensitive::EquivClassSize; i++)
                {
                    bool alreadyAdded = false;

                    for (int j = 0; j < i; j++)
                    {
                        if (equivClass[i] == equivClass[j])
                        {
                            alreadyAdded = true;
                            break;
                        }
                    }

                    if (!alreadyAdded)
                    {
                        if (Js::NumberUtilities::IsInSupplementaryPlane(equivClass[i]))
                        {
                            Js::NumberUtilities::CodePointAsSurrogatePair(equivClass[i], &lower, &upper);
                            equivNode[indexForNextNode] = CreateSurrogatePairAtom(lower, upper);
                        }
                        else
                        {
                            equivNode[indexForNextNode] = Anew(ctAllocator, MatchCharNode, (Char)equivClass[i]);
                        }
                        indexForNextNode ++;
                    }
                }
                Assert(indexForNextNode > 0);
                if (indexForNextNode == 1)
                {
                    node = equivNode[0];
                }
                else
                {
                    AltNode *altNode = Anew(ctAllocator, AltNode, equivNode[0], nullptr);
                    AltNode *altNodeTail = altNode;
                    for (int i = 1; i < indexForNextNode; i++)
                    {
                        altNodeTail->tail = Anew(ctAllocator, AltNode, equivNode[i], nullptr);
                        altNodeTail = altNodeTail->tail;
                    }
                    node = altNode;
                }
            }
            else
            {
                Js::NumberUtilities::CodePointAsSurrogatePair(this->currentSurrogatePairNode->value, &lower, &upper);
                node = CreateSurrogatePairAtom(lower, upper);
            }

            previousSurrogatePart = false;

            Assert(ECCanConsume(this->currentSurrogatePairNode->length));
            ECConsumeMultiUnit(this->currentSurrogatePairNode->length);
            this->RestoreMultiUnits(this->currentSurrogatePairNode->multiUnits);
            this->currentSurrogatePairNode = this->currentSurrogatePairNode->next;

            return true;
        }

        return false;
    }